

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCuSu.cpp
# Opt level: O0

void __thiscall NaPNCuSum::action(NaPNCuSum *this)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  NaPetriNet *pNVar4;
  NaTimer *pNVar5;
  NaVector *pNVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  NaPetriNode *in_RDI;
  double extraout_XMM0_Qa;
  _func_int **pp_Var7;
  _func_int **extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar8;
  _func_int **extraout_XMM0_Qa_03;
  NaReal in_stack_00000010;
  NaReal in_stack_00000018;
  NaPNCuSum *in_stack_00000020;
  NaPetriCnInput *in_stack_ffffffffffffffd8;
  
  pcVar1 = in_RDI[6].szName;
  pNVar4 = NaPetriNode::net(in_RDI);
  pNVar5 = NaPetriNet::timer(pNVar4);
  (*pNVar5->_vptr_NaTimer[4])();
  if ((double)pcVar1 <= extraout_XMM0_Qa) {
    pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffffd8);
    (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
    pp_Var7 = (_func_int **)imaging_point(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    in_RDI[6]._vptr_NaPetriNode = pp_Var7;
    if ((double)in_RDI[6]._vptr_NaPetriNode <= 0.0 && (double)in_RDI[6]._vptr_NaPetriNode != 0.0) {
      in_RDI[6]._vptr_NaPetriNode = (_func_int **)0x0;
    }
    pp_Var7 = in_RDI[6]._vptr_NaPetriNode;
    pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
    iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
    *(_func_int ***)CONCAT44(extraout_var_01,iVar3) = pp_Var7;
    if ((double)in_RDI[6]._vptr_NaPetriNode < *(double *)&in_RDI[5].bHalt ||
        (double)in_RDI[6]._vptr_NaPetriNode == *(double *)&in_RDI[5].bHalt) {
      pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      *(undefined8 *)CONCAT44(extraout_var_07,iVar3) = 0;
    }
    else {
      if (0.0 < (double)in_RDI[6].pNet) {
        if (0.0 < (double)in_RDI[6].pcaPorts._vptr_NaDynAr ||
            (double)in_RDI[6].pcaPorts._vptr_NaDynAr == 0.0) {
          pNVar4 = NaPetriNode::net(in_RDI);
          pNVar5 = NaPetriNet::timer(pNVar4);
          (*pNVar5->_vptr_NaTimer[4])();
          if ((double)in_RDI[6].pNet <
              extraout_XMM0_Qa_01 - (double)in_RDI[6].pcaPorts._vptr_NaDynAr) {
            pNVar4 = NaPetriNode::net(in_RDI);
            pNVar5 = NaPetriNet::timer(pNVar4);
            (*pNVar5->_vptr_NaTimer[4])();
            dVar8 = extraout_XMM0_Qa_02 - (double)in_RDI[6].pcaPorts._vptr_NaDynAr;
            if ((double)in_RDI[6].pNet <= dVar8 && dVar8 != (double)in_RDI[6].pNet) {
              pNVar4 = NaPetriNode::net(in_RDI);
              pNVar5 = NaPetriNet::timer(pNVar4);
              (*pNVar5->_vptr_NaTimer[4])();
              in_RDI[6].pcaPorts._vptr_NaDynAr = extraout_XMM0_Qa_03;
              pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
              iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
              *(undefined8 *)CONCAT44(extraout_var_05,iVar3) = 0;
            }
          }
          else {
            in_RDI[6].pcaPorts._vptr_NaDynAr = (_func_int **)0xbff0000000000000;
            pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
            iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
            *(undefined8 *)CONCAT44(extraout_var_04,iVar3) = 0x3ff0000000000000;
          }
        }
        else {
          pNVar4 = NaPetriNode::net(in_RDI);
          pNVar5 = NaPetriNet::timer(pNVar4);
          (*pNVar5->_vptr_NaTimer[4])();
          in_RDI[6].pcaPorts._vptr_NaDynAr = extraout_XMM0_Qa_00;
          pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
          iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
          *(undefined8 *)CONCAT44(extraout_var_03,iVar3) = 0;
        }
      }
      else {
        pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
        iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
        *(undefined8 *)CONCAT44(extraout_var_02,iVar3) = 0x3ff0000000000000;
      }
      in_RDI[6]._vptr_NaPetriNode = (_func_int **)0x0;
      uVar2 = *(undefined8 *)&in_RDI[5].bHalt;
      pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
      iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      *(undefined8 *)CONCAT44(extraout_var_06,iVar3) = uVar2;
    }
  }
  else {
    pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
    iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
    *(undefined8 *)CONCAT44(extraout_var,iVar3) = 0;
    pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
    iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
    *(undefined8 *)CONCAT44(extraout_var_00,iVar3) = 0;
  }
  return;
}

Assistant:

void
NaPNCuSum::action ()
{
  if(fStartTime > net()->timer().CurrentTime())
    {
      // "turned-off" mode to wait for predefined moment
      sum.data()[0]  = 0.0;
      d.data()[0] = 0;
      return;
    }

  fS = imaging_point(fS, x.data()[0]);
  if(fS < 0.0)
    fS = 0.0;

  sum.data()[0]  = fS;
  /*
  NaPrintLog("'%s' -> check %g > %g (at %d) fATAD=%g\n",
	     name(), fS, fTopVal, net()->timer().CurrentIndex(), fATAD);
  */
  // compute detection signal here
  if(fS > fTopVal)
    {
      if(fATAD <= 0.0)
	{
	  /* unconditional alarm */
	  d.data()[0] = 1;
	  /*
	  NaPrintLog("'%s' -> unconditional alarm (at %d)\n",
		     name(), net()->timer().CurrentIndex());
	  */
	}
      else
	{
	  if(fPrevTA < 0)
	    {
	      /* first alarm: let's check it */
	      fPrevTA = net()->timer().CurrentTime();
	      d.data()[0] = 0;
	      /*
	      NaPrintLog("'%s' -> first alarm (at %d)\n",
			 name(), net()->timer().CurrentIndex());
	      */
	    }
	  else if(net()->timer().CurrentTime() - fPrevTA <= fATAD)
	    {
	      /* second alarm: fits average time of alarm delay */
	      fPrevTA = -1.0;
	      d.data()[0] = 1;
	      /*
	      NaPrintLog("'%s' -> second alarm (at %d) -> YES\n",
			 name(), net()->timer().CurrentIndex());
	      */
	    }
	  else if(net()->timer().CurrentTime() - fPrevTA > fATAD)
	    {
	      /* second alarm: out of average time of alarm delay */
	      fPrevTA = net()->timer().CurrentTime();
	      d.data()[0] = 0;
	      /*
	      NaPrintLog("'%s' -> second alarm (at %d) -> NO\n",
			 name(), net()->timer().CurrentIndex());
	      */
	    }
	}
      /* reset sum to initial one */
      fS = 0.0;

      /* show imaging point as threshold value */
      sum.data()[0]  = fTopVal;
    }
  else
    d.data()[0] = 0;
}